

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

int birthday_sample(int n,int *seed)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  if (n < 1) {
    uVar6 = 0;
  }
  else {
    piVar2 = i4vec_uniform_ab_new(n,1,0x16d,seed);
    uVar3 = n - 1;
    uVar6 = 0;
    iVar5 = 0;
    if (n != 1) {
      uVar4 = 0;
      iVar7 = 0;
      do {
        iVar5 = iVar7 + 1;
        if (uVar4 != 0) {
          uVar8 = 0;
          do {
            iVar5 = iVar7;
            if (piVar2[uVar4] == piVar2[uVar8]) break;
            uVar8 = uVar8 + 1;
            iVar5 = iVar7 + 1;
          } while (uVar4 != uVar8);
        }
        uVar4 = uVar4 + 1;
        iVar7 = iVar5;
      } while (uVar4 != uVar3);
    }
    if ((int)uVar3 <= iVar5) {
      uVar4 = 0;
      uVar6 = 0;
      do {
        uVar1 = uVar6 + 1;
        if (uVar4 != 0) {
          uVar8 = 0;
          do {
            uVar1 = uVar6;
            if (piVar2[uVar4] == piVar2[uVar8]) break;
            uVar8 = uVar8 + 1;
            uVar1 = uVar6 + 1;
          } while (uVar4 != uVar8);
        }
        uVar6 = uVar1;
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)n);
      uVar6 = (uint)(uVar6 == uVar3);
      operator_delete__(piVar2);
    }
  }
  return uVar6;
}

Assistant:

int birthday_sample ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    BIRTHDAY_SAMPLE samples the Birthday Concurrence PDF.
//
//  Discussion:
//
//    The probability is the probability that the N-th person is the
//    first one to match a birthday with someone earlier.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 March 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of people whose birthdays have been
//    disclosed.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, int BIRTHDAY_SAMPLE,
//    * 1 if the first N-1 people had distinct
//      birthdays, but person N had a birthday in common with a previous person,
//    * 0 otherwise.
//
{
  int *b;
  int u1;
  int u2;
  int value;

  if ( n < 1 )
  {
    value = 0;
    return value;
  }
//
//  Choose N birthdays at random.
//
  b = i4vec_uniform_ab_new ( n, 1, 365, seed );
//
//  Are the first N-1 birthdays unique?
//
  u1 = i4vec_unique_count ( n - 1, b );

  if ( u1 < n - 1 )
  {
    value = 0;
    return value;
  }
//
//  Does the N-th birthday match an earlier one?
//
  u2 = i4vec_unique_count ( n, b );

  if ( u2 == n - 1 )
  {
    value = 1;
  }
  else
  {
    value = 0;
  }

  delete [] b;

  return value;
}